

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void process_world(chunk_conflict *c)

{
  ushort uVar1;
  int16_t iVar2;
  level_conflict *plVar3;
  bool bVar4;
  player *ppVar5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  int iVar10;
  loc_conflict lVar11;
  square_conflict *psVar12;
  source sVar13;
  source origin;
  source origin_00;
  int16_t local_c8;
  int16_t local_c4;
  wchar_t local_ac;
  level_conflict *lev;
  wchar_t target_place;
  wchar_t increment;
  wchar_t new_last_place;
  _Bool changed;
  trap *trap;
  loc grid;
  int32_t d;
  wchar_t decrement;
  wchar_t drain;
  _Bool hardy;
  _Bool local_1f;
  byte local_1e;
  byte local_1d;
  wchar_t local_1c;
  _Bool ident;
  _Bool dawn;
  wchar_t wStack_18;
  _Bool was_ghost;
  wchar_t x;
  wchar_t y;
  wchar_t i;
  chunk_conflict *c_local;
  
  local_1d = 0;
  _y = (chunk_conflict2 *)c;
  wVar7 = cave_monster_count(c);
  if ((int)(uint)z_info->level_monster_max < wVar7 + L' ') {
    compact_monsters((chunk *)_y,L'@');
  }
  wVar7 = cave_monster_count((chunk_conflict *)_y);
  wVar8 = cave_monster_max((chunk_conflict *)_y);
  if (wVar7 + L' ' < wVar8) {
    compact_monsters((chunk *)_y,L'\0');
  }
  if ((long)turn % (long)(((ulong)z_info->day_length * 10) / 4) == 0) {
    play_ambient_sound();
  }
  _Var6 = outside();
  if ((_Var6) && ((long)turn % (long)(((ulong)z_info->day_length * 10) / 2) == 0)) {
    local_1e = ((long)turn % (long)((ulong)z_info->day_length * 10) != 0 ^ 0xffU) & 1;
    if (local_1e == 0) {
      msg("The sun has fallen.");
    }
    else {
      msg("The sun has risen.");
      sun_banish();
    }
    cave_illuminate((chunk *)_y,(_Bool)(local_1e & 1));
  }
  if ((player->depth != 0) && ((long)turn % (long)((ulong)z_info->store_turns * 10) == 0)) {
    daycount = daycount + 1;
  }
  _Var6 = flag_has_dbg((player->state).pflags,10,0x1f,"player->state.pflags","(PF_UNLIGHT)");
  if (_Var6) {
    player->upkeep->update = player->upkeep->update | 1;
  }
  if (_y->ghost->bones_selector != L'\0') {
    local_1d = 1;
  }
  uVar9 = Rand_div((uint)z_info->alloc_monster_chance);
  if ((uVar9 == 0) && (player->themed_level == '\0')) {
    lVar11.x = (player->grid).x;
    lVar11.y = (player->grid).y;
    pick_and_place_distant_monster
              ((chunk *)_y,lVar11,(uint)z_info->max_sight + L'\x05',true,(int)player->depth);
  }
  if ((_y->ghost->bones_selector != L'\0') && ((local_1d & 1) == 0)) {
    if ((_y->ghost == (ghost_info *)0x0) || (_y->ghost->race == L'\0')) {
      __assert_fail("c->ghost && c->ghost->race",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-world.c"
                    ,0x28c,"void process_world(struct chunk *)");
    }
    ghost_challenge();
  }
  ppVar5 = player;
  if (player->timed[7] != 0) {
    wVar7 = player_apply_damage_reduction(player,L'\x01');
    take_hit(ppVar5,wVar7,"poison");
    if ((player->is_dead & 1U) != 0) {
      return;
    }
  }
  if (player->timed[8] != 0) {
    _Var6 = flag_has_dbg((player->state).pflags,10,1,"player->state.pflags","(PF_ROCK)");
    if (_Var6) {
      x = L'\0';
    }
    else {
      _Var6 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
      if ((_Var6) || (_Var6 = player_timed_grade_eq(player,L'\b',"Deep Gash"), _Var6)) {
        x = L'\x03';
      }
      else {
        _Var6 = player_timed_grade_eq(player,L'\b',"Severe Cut");
        if (_Var6) {
          x = L'\x02';
        }
        else {
          x = L'\x01';
        }
      }
    }
    ppVar5 = player;
    wVar7 = player_apply_damage_reduction(player,x);
    take_hit(ppVar5,wVar7,"a fatal wound");
    if ((player->is_dead & 1U) != 0) {
      return;
    }
  }
  if (player->timed[0x31] != 0) {
    if (10 - player->timed[0x31] < 1) {
      local_ac = L'\0';
    }
    else {
      local_ac = L'\n' - player->timed[0x31];
    }
    player_over_exert(player,L'È',local_ac,(int)player->chp / 10);
    if ((player->is_dead & 1U) != 0) {
      return;
    }
  }
  if (player->timed[0x2b] != 0) {
    local_1f = false;
    sVar13 = source_player();
    origin.which = sVar13.which;
    origin._4_4_ = 0;
    origin.what = sVar13.what;
    effect_simple(L'\x03',origin,"30",L'\0',L'\0',L'\0',L'\0',L'\0',&local_1f);
  }
  if (player->timed[0x32] != 0) {
    _Var6 = flag_has_dbg((player->state).pflags,10,0x10,"player->state.pflags","(PF_HARDY)");
    uVar9 = 2;
    if (_Var6) {
      uVar9 = 4;
    }
    uVar9 = Rand_div(uVar9);
    if (uVar9 == 0) {
      msg("The Black Breath sickens you.");
      player_stat_dec(player,L'\x04',false);
    }
    uVar9 = 2;
    if (_Var6) {
      uVar9 = 4;
    }
    uVar9 = Rand_div(uVar9);
    if (uVar9 == 0) {
      msg("The Black Breath saps your strength.");
      player_stat_dec(player,L'\0',false);
    }
    uVar9 = 2;
    if (_Var6) {
      uVar9 = 4;
    }
    uVar9 = Rand_div(uVar9);
    if (uVar9 == 0) {
      iVar10 = player->exp;
      uVar1 = z_info->life_drain_percent;
      msg("The Black Breath dims your life force.");
      player_exp_lose(player,(iVar10 / 100) * (uint)uVar1 + 100,false);
    }
  }
  _Var6 = player_timed_grade_eq(player,L'\n',"Full");
  if (_Var6) {
    player_dec_timed(player,L'\n',(wchar_t)(5000 / (ulong)(long)(int)(uint)z_info->food_value),false
                     ,true);
    player->upkeep->update = player->upkeep->update | 1;
  }
  else {
    if (turn % 100 == 0) {
      wVar7 = turn_energy((player->state).speed);
      x = (wVar7 * 100) / (int)(uint)z_info->food_value;
      _Var6 = player_of_has(player,L'\f');
      if (_Var6) {
        x = x << 1;
      }
      _Var6 = player_of_has(player,L'\n');
      if (_Var6) {
        x = x / 2;
      }
      if (x < L'\x01') {
        x = L'\x01';
      }
      player_dec_timed(player,L'\n',x,false,true);
    }
    if ((player->timed[0x2b] != 0) &&
       (player_dec_timed(player,L'\n',(uint)z_info->food_value << 3,false,true),
       player->timed[10] < PY_FOOD_HUNGRY)) {
      player_set_timed(player,L'+',L'\0',true,true);
    }
  }
  _Var6 = player_timed_grade_eq(player,L'\n',"Faint");
  if (_Var6) {
    if ((player->timed[3] == 0) && (uVar9 = Rand_div(10), uVar9 == 0)) {
      msg("You faint from the lack of food.");
      disturb(player);
      ppVar5 = player;
      uVar9 = Rand_div(5);
      player_inc_timed(ppVar5,L'\x03',uVar9 + L'\x01',true,true,false);
    }
  }
  else {
    _Var6 = player_timed_grade_eq(player,L'\n',"Starving");
    ppVar5 = player;
    if (_Var6) {
      x = (PY_FOOD_STARVE - player->timed[10]) / 10;
      wVar7 = player_apply_damage_reduction(player,x);
      take_hit(ppVar5,wVar7,"starvation");
      if ((player->is_dead & 1U) != 0) {
        return;
      }
    }
  }
  if (player->chp < player->mhp) {
    player_regen_hp(player);
  }
  player_regen_mana(player);
  decrease_timeouts();
  if (player->heighten_power != 0) {
    iVar10 = (int)player->heighten_power / 0x37 + 10;
    if (player->heighten_power - iVar10 < 1) {
      local_c4 = 0;
    }
    else {
      local_c4 = player->heighten_power - (short)iVar10;
    }
    player->heighten_power = local_c4;
    player->upkeep->update = player->upkeep->update | 1;
  }
  if (player->speed_boost != 0) {
    if (player->speed_boost + -10 < 0) {
      local_c8 = 0;
    }
    else {
      local_c8 = player->speed_boost + -10;
    }
    player->speed_boost = local_c8;
    player->upkeep->update = player->upkeep->update | 1;
  }
  player_update_light(player);
  _Var6 = player_is_resting(player);
  if (!_Var6) {
    make_noise(cave,player,(monster_conflict *)0x0);
    update_scent(cave,player,(monster_conflict *)0x0);
  }
  _Var6 = player_of_has(player,L'\x1f');
  if (_Var6) {
    if ((0 < player->exp) && (uVar9 = Rand_div(10), uVar9 == 0)) {
      iVar10 = damroll(10,6);
      player_exp_lose(player,(int)(iVar10 + (player->exp / 100) * (uint)z_info->life_drain_percent)
                             / 10,false);
    }
    equip_learn_flag(player,L'\x1f');
  }
  recharge_objects();
  if (turn % 100 == 0) {
    equip_learn_after_time(player);
  }
  for (wStack_18 = L'\0'; wStack_18 < _y->height; wStack_18 = wStack_18 + L'\x01') {
    for (local_1c = L'\0'; local_1c < _y->width; local_1c = local_1c + L'\x01') {
      lVar11 = (loc_conflict)loc(local_1c,wStack_18);
      psVar12 = square((chunk *)_y,lVar11);
      bVar4 = false;
      for (_new_last_place = psVar12->trap; _new_last_place != (trap *)0x0;
          _new_last_place = _new_last_place->next) {
        if ((_new_last_place->timeout != '\0') &&
           (_new_last_place->timeout = _new_last_place->timeout + 0xff,
           _new_last_place->timeout == '\0')) {
          bVar4 = true;
        }
      }
      if ((bVar4) && (_Var6 = square_isseen((chunk *)_y,lVar11), _Var6)) {
        square_memorize_traps(_y,lVar11);
        square_light_spot((chunk *)_y,(loc)lVar11);
      }
    }
  }
  if (((player->word_recall != 0) && ((player->upkeep->arena_level & 1U) == 0)) &&
     (player->word_recall = player->word_recall + -1, player->word_recall == 0)) {
    disturb(player);
    cmdq_flush();
    if (player->place == player->home) {
      msgt(0x19,"You feel yourself yanked away!");
      player_change_place(player,(int)player->recall_pt);
    }
    else {
      if ((player->upkeep->arena_level & 1U) == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = player->last_place;
      }
      msgt(0x19,"You feel yourself yanked homewards!");
      player_change_place(player,(int)player->home);
      player->last_place = iVar2;
    }
  }
  if ((player->deep_descent != 0) &&
     (player->deep_descent = player->deep_descent + -1, player->deep_descent == 0)) {
    wVar7 = player_get_next_place((int)player->place,"down",L'\x05');
    plVar3 = world->levels;
    disturb(player);
    if ((int)player->depth < plVar3[wVar7].depth) {
      msgt(0x19,"The floor opens beneath you!");
      player_change_place(player,wVar7);
    }
    else {
      msgt(0x19,"You are thrown back in an explosion!");
      sVar13 = source_none();
      origin_00.which = sVar13.which;
      origin_00._4_4_ = 0;
      origin_00.what = sVar13.what;
      effect_simple(L'@',origin_00,"0",L'\0',L'\x05',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
  }
  return;
}

Assistant:

void process_world(struct chunk *c)
{
	int i, y, x;
	bool was_ghost = false;

	/* Compact the monster list if we're approaching the limit */
	if (cave_monster_count(c) + 32 > z_info->level_monster_max)
		compact_monsters(c, 64);

	/* Too many holes in the monster list - compress */
	if (cave_monster_count(c) + 32 < cave_monster_max(c))
		compact_monsters(c, 0);

	/*** Check the Time ***/

	/* Play an ambient sound at regular intervals. */
	if (!(turn % ((10L * z_info->day_length) / 4)))
		play_ambient_sound();

	/* Handle stores and sunshine */
	if (outside()) {
		/* Daybreak/Nightfall in town */
		if (!(turn % ((10L * z_info->day_length) / 2))) {
			/* Check for dawn */
			bool dawn = (!(turn % (10L * z_info->day_length)));

			if (dawn) {
				/* Day breaks */
				msg("The sun has risen.");
				sun_banish();
			} else {
				/* Night falls */
				msg("The sun has fallen.");
			}

			/* Illuminate */
			cave_illuminate(c, dawn);
		}
	}

	/* Update the stores once a day.  The changes are not actually made until
	 * return to town, to avoid giving details away in the knowledge menu. */
	if (player->depth && !(turn % (10L * z_info->store_turns))) daycount++;

	/* Check for light change */
	if (player_has(player, PF_UNLIGHT)) {
		player->upkeep->update |= PU_BONUS;
	}

	/* See if there is already a player ghost on the level */
	if (c->ghost->bones_selector) {
		was_ghost = true;
	}

	/* Check for creature generation */
	if (one_in_(z_info->alloc_monster_chance) && (!player->themed_level)) {
		(void)pick_and_place_distant_monster(c, player->grid,
			z_info->max_sight + 5, true, player->depth);
	}

	/* If there is ghost now, and there was not before, give a challenge */
	if (c->ghost->bones_selector && !was_ghost) {
		assert(c->ghost && c->ghost->race);
		ghost_challenge();
	}

	/*** Damage (or healing) over Time ***/

	/* Take damage from poison */
	if (player->timed[TMD_POISONED]) {
		take_hit(player, player_apply_damage_reduction(player, 1),
			"poison");
		if (player->is_dead) {
			return;
		}
	}

	/* Take damage from cuts, worse from serious cuts */
	if (player->timed[TMD_CUT]) {
		if (player_has(player, PF_ROCK)) {
			/* Rock players just maintain */
			i = 0;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Mortal Wound") ||
				   player_timed_grade_eq(player, TMD_CUT, "Deep Gash")) {
			i = 3;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Severe Cut")) {
			i = 2;
		} else {
			i = 1;
		}

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"a fatal wound");
		if (player->is_dead) {
			return;
		}
	}

	/* Side effects of diminishing bloodlust */
	if (player->timed[TMD_BLOODLUST]) {
		player_over_exert(player, PY_EXERT_HP | PY_EXERT_CUT | PY_EXERT_SLOW,
						  MAX(0, 10 - player->timed[TMD_BLOODLUST]),
						  player->chp / 10);
		if (player->is_dead) {
			return;
		}
	}

	/* Timed healing */
	if (player->timed[TMD_HEAL]) {
		bool ident = false;
		effect_simple(EF_HEAL_HP, source_player(), "30", 0, 0, 0, 0, 0, &ident);
	}

	/* Effects of Black Breath */
	if (player->timed[TMD_BLACKBREATH]) {
		bool hardy = player_has(player, PF_HARDY);

		if (one_in_(hardy ? 4 : 2)) {
			msg("The Black Breath sickens you.");
			player_stat_dec(player, STAT_CON, false);
		}
		if (one_in_(hardy ? 4 : 2)) {
			msg("The Black Breath saps your strength.");
			player_stat_dec(player, STAT_STR, false);
		}
		if (one_in_(hardy ? 4 : 2)) {
			/* Life draining */
			int drain = 100 + (player->exp / 100) * z_info->life_drain_percent;
			msg("The Black Breath dims your life force.");
			player_exp_lose(player, drain, false);
		}
	}

	/*** Check the Food, and Regenerate ***/

	/* Digest */
	if (!player_timed_grade_eq(player, TMD_FOOD, "Full")) {
		/* Digest normally */
		if (!(turn % 100)) {
			/* Basic digestion rate based on speed */
			i = turn_energy(player->state.speed);

			/* Adjust for food value */
			i = (i * 100) / z_info->food_value;

			/* Regeneration takes more food */
			if (player_of_has(player, OF_REGEN)) i *= 2;

			/* Slow digestion takes less food */
			if (player_of_has(player, OF_SLOW_DIGEST)) i /= 2;

			/* Minimal digestion */
			if (i < 1) i = 1;

			/* Digest some food */
			player_dec_timed(player, TMD_FOOD, i, false, true);
		}

		/* Fast metabolism */
		if (player->timed[TMD_HEAL]) {
			player_dec_timed(player, TMD_FOOD,
				8 * z_info->food_value, false, true);
			if (player->timed[TMD_FOOD] < PY_FOOD_HUNGRY) {
				player_set_timed(player, TMD_HEAL, 0, true,
					true);
			}
		}
	} else {
		/* Digest quickly when gorged */
		player_dec_timed(player, TMD_FOOD, 5000 / z_info->food_value,
			false, true);
		player->upkeep->update |= PU_BONUS;
	}

	/* Faint or starving */
	if (player_timed_grade_eq(player, TMD_FOOD, "Faint")) {
		/* Faint occasionally */
		if (!player->timed[TMD_PARALYZED] && one_in_(10)) {
			/* Message */
			msg("You faint from the lack of food.");
			disturb(player);

			/* Faint (bypass free action) */
			(void)player_inc_timed(player, TMD_PARALYZED,
				1 + randint0(5), true, true, false);
		}
	} else if (player_timed_grade_eq(player, TMD_FOOD, "Starving")) {
		/* Calculate damage */
		i = (PY_FOOD_STARVE - player->timed[TMD_FOOD]) / 10;

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"starvation");
		if (player->is_dead) {
			return;
		}
	}

	/* Regenerate Hit Points if needed */
	if (player->chp < player->mhp)
		player_regen_hp(player);

	/* Regenerate or lose mana */
	player_regen_mana(player);

	/* Timeout various things */
	decrease_timeouts();

	/* Decay special heighten power */
	if (player->heighten_power) {
		/* To keep it from being a free ride for high speed 
		 * characters, Heighten Power decays quickly when highly charged */
		int decrement = 10 + (player->heighten_power / 55);
		player->heighten_power = MAX(0, player->heighten_power - decrement);
		player->upkeep->update |= (PU_BONUS);
	}

	/* Decay special speed boost */
	if (player->speed_boost) {
		player->speed_boost = MAX(player->speed_boost - 10, 0);
		player->upkeep->update |= (PU_BONUS);
	}

	/* Process light */
	player_update_light(player);

	/* Update noise and scent (not if resting) */
	if (!player_is_resting(player)) {
		make_noise(cave, player, NULL);
		update_scent(cave, player, NULL);
	}

	/*** Process Inventory ***/

	/* Handle experience draining */
	if (player_of_has(player, OF_DRAIN_EXP)) {
		if ((player->exp > 0) && one_in_(10)) {
			int32_t d = damroll(10, 6) +
				(player->exp / 100) * z_info->life_drain_percent;
			player_exp_lose(player, d / 10, false);
		}

		equip_learn_flag(player, OF_DRAIN_EXP);
	}

	/* Recharge activatable objects and rods */
	recharge_objects();

	/* Notice things after time */
	if (!(turn % 100))
		equip_learn_after_time(player);

	/* Decrease trap timeouts */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct trap *trap = square(c, grid)->trap;
			bool changed = false;
			while (trap) {
				if (trap->timeout) {
					trap->timeout--;
					if (!trap->timeout) {
						changed = true;
					}
				}
				trap = trap->next;
			}
			if (changed && square_isseen(c, grid)) {
				square_memorize_traps(c, grid);
				square_light_spot(c, grid);
			}
		}
	}


	/*** Involuntary Movement ***/

	/* Delayed Word-of-Recall; suspended in arenas */
	if (player->word_recall && !player->upkeep->arena_level) {
		/* Count down towards recall */
		player->word_recall--;

		/* Activate the recall */
		if (!player->word_recall) {
			/*
			 * Disturbing!  Also, flush the command queue to avoid
			 * losing an action on the new level
			 */
			disturb(player);
			cmdq_flush();

			/* Determine the level */
			if (player->place != player->home) {
				int new_last_place = (player->upkeep->arena_level) ? player->last_place : 0;
				msgt(MSG_TPLEVEL, "You feel yourself yanked homewards!");
				player_change_place(player, player->home);
				player->last_place = new_last_place;
			} else {
				msgt(MSG_TPLEVEL, "You feel yourself yanked away!");
				player_change_place(player, player->recall_pt);
			}
		}
	}

	/* Delayed Deep Descent */
	if (player->deep_descent) {
		/* Count down towards descent */
		player->deep_descent--;

		/* Activate the descent */
		if (player->deep_descent == 0) {
			int increment;
			int target_place = player->max_depth;
			struct level *lev;

			/* Calculate target depth */
			//increment = (4 / z_info->stair_skip) + 1;
			increment = 5;
			target_place = player_get_next_place(player->place, "down",
												 increment);
			lev = &world->levels[target_place];

			disturb(player);

			/* Determine the level */
			if (lev->depth > player->depth) {
				msgt(MSG_TPLEVEL, "The floor opens beneath you!");
				player_change_place(player, target_place);
			} else {
				/* Otherwise do something disastrous */
				msgt(MSG_TPLEVEL, "You are thrown back in an explosion!");
				effect_simple(EF_DESTRUCTION, source_none(), "0", 0, 5, 0, 0, 0, NULL);
			}
		}
	}
}